

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O2

uint32_t crc32(uint32_t seed,uchar *buf,size_t len)

{
  size_t sVar1;
  uchar *p;
  uint32_t crc;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    seed = seed >> 8 ^ crc_32_tab[(byte)(buf[sVar1] ^ (byte)seed)];
  }
  return seed;
}

Assistant:

uint32_t crc32(uint32_t seed, const unsigned char *buf, size_t len)
{
    uint32_t crc = seed;
    const unsigned char *p = buf;

    while (len) {
        crc = crc_32_tab[(crc ^ *p++) & 0xff] ^ (crc >> 8);
        len--;
    }

    return crc;
}